

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int mbedtls_aes_crypt_ctr
              (mbedtls_aes_context *ctx,size_t length,size_t *nc_off,uchar *nonce_counter,
              uchar *stream_block,uchar *input,uchar *output)

{
  uchar uVar1;
  ulong local_50;
  size_t n;
  int i;
  int c;
  uchar *input_local;
  uchar *stream_block_local;
  uchar *nonce_counter_local;
  size_t *nc_off_local;
  size_t length_local;
  mbedtls_aes_context *ctx_local;
  
  local_50 = *nc_off;
  _i = input;
  nc_off_local = (size_t *)length;
  if (local_50 < 0x10) {
    while (nc_off_local != (size_t *)0x0) {
      if (local_50 == 0) {
        mbedtls_aes_crypt_ecb(ctx,1,nonce_counter,stream_block);
        n._0_4_ = 0x10;
        while ((0 < (int)n &&
               (uVar1 = nonce_counter[(int)n + -1], nonce_counter[(int)n + -1] = uVar1 + '\x01',
               (uchar)(uVar1 + '\x01') == '\0'))) {
          n._0_4_ = (int)n + -1;
        }
      }
      *output = *_i ^ stream_block[local_50];
      local_50 = local_50 + 1 & 0xf;
      output = output + 1;
      _i = _i + 1;
      nc_off_local = (size_t *)((long)nc_off_local + -1);
    }
    *nc_off = local_50;
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = -0x21;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_aes_crypt_ctr( mbedtls_aes_context *ctx,
                       size_t length,
                       size_t *nc_off,
                       unsigned char nonce_counter[16],
                       unsigned char stream_block[16],
                       const unsigned char *input,
                       unsigned char *output )
{
    int c, i;
    size_t n;

    AES_VALIDATE_RET( ctx != NULL );
    AES_VALIDATE_RET( nc_off != NULL );
    AES_VALIDATE_RET( nonce_counter != NULL );
    AES_VALIDATE_RET( stream_block != NULL );
    AES_VALIDATE_RET( input != NULL );
    AES_VALIDATE_RET( output != NULL );

    n = *nc_off;

    if ( n > 0x0F )
        return( MBEDTLS_ERR_AES_BAD_INPUT_DATA );

    while( length-- )
    {
        if( n == 0 ) {
            mbedtls_aes_crypt_ecb( ctx, MBEDTLS_AES_ENCRYPT, nonce_counter, stream_block );

            for( i = 16; i > 0; i-- )
                if( ++nonce_counter[i - 1] != 0 )
                    break;
        }
        c = *input++;
        *output++ = (unsigned char)( c ^ stream_block[n] );

        n = ( n + 1 ) & 0x0F;
    }

    *nc_off = n;

    return( 0 );
}